

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * __thiscall cmTarget::GetSuffixVariableInternal(cmTarget *this,bool implib)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  string local_40;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
      cVar3 = '\0';
    }
    else {
      cVar3 = this->IsAndroid;
      if ((bool)cVar3 == true) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ANDROID_GUI","");
        pcVar2 = GetProperty(this,&local_40,this->Makefile);
        bVar1 = cmSystemTools::IsOn(pcVar2);
      }
      else {
        bVar1 = false;
      }
      pcVar2 = "CMAKE_EXECUTABLE_SUFFIX";
      if (bVar1 != false) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
      }
    }
    if ((cVar3 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    pcVar2 = "CMAKE_STATIC_LIBRARY_SUFFIX";
    break;
  case SHARED_LIBRARY:
    pcVar2 = "CMAKE_SHARED_LIBRARY_SUFFIX";
    goto LAB_0036a45d;
  case MODULE_LIBRARY:
    pcVar2 = "CMAKE_SHARED_MODULE_SUFFIX";
LAB_0036a45d:
    if (implib) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
    }
    break;
  default:
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

void cmTarget::SetType(cmState::TargetType type, const std::string& name)
{
  this->Name = name;
  // only add dependency information for library targets
  this->TargetTypeValue = type;
  if(this->TargetTypeValue >= cmState::STATIC_LIBRARY
     && this->TargetTypeValue <= cmState::MODULE_LIBRARY)
    {
    this->RecordDependencies = true;
    }
  else
    {
    this->RecordDependencies = false;
    }
}